

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O3

uint zvgEcpPutMem(uchar *mem,uint memSize)

{
  uint uVar1;
  long lVar2;
  
  if (memSize == 0) {
    return 0;
  }
  lVar2 = 0;
  do {
    uVar1 = zvgEcpPutc(mem[lVar2]);
    if (uVar1 != 0) {
      return uVar1;
    }
    lVar2 = lVar2 + 1;
  } while (memSize != (uint)lVar2);
  return 0;
}

Assistant:

uint zvgEcpPutMem( uchar *mem, uint memSize)
{
	uint	err;

	err = errOk;

	while (memSize-- > 0)
	{
		err = zvgEcpPutc( *mem);

		if (err)
			break;

		else
			mem++;
	}
	return (err);
}